

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdfdrivr.c
# Opt level: O3

FT_UInt bdf_cmap_char_index(FT_CMap bdfcmap,FT_UInt32 charcode)

{
  long lVar1;
  ulong uVar2;
  FT_Face pFVar3;
  FT_Face pFVar4;
  BDF_CMap cmap;
  FT_Face pFVar5;
  
  pFVar3 = bdfcmap[1].charmap.face;
  if (pFVar3 == (FT_Face)0x0) {
    return 0;
  }
  lVar1 = *(long *)&bdfcmap[1].charmap.encoding;
  pFVar4 = (FT_Face)0x0;
  do {
    pFVar5 = (FT_Face)((ulong)((long)&pFVar3->num_faces + (long)&pFVar4->num_faces) >> 1);
    uVar2 = *(ulong *)(lVar1 + (long)pFVar5 * 0x10);
    if (uVar2 == charcode) {
      return *(int *)(lVar1 + (long)pFVar5 * 0x10 + 8) + 1U & 0xffff;
    }
    if (uVar2 <= charcode) {
      pFVar4 = (FT_Face)((long)&pFVar5->num_faces + 1);
      pFVar5 = pFVar3;
    }
    pFVar3 = pFVar5;
  } while (pFVar4 < pFVar5);
  return 0;
}

Assistant:

FT_CALLBACK_DEF( FT_UInt )
  bdf_cmap_char_index( FT_CMap    bdfcmap,
                       FT_UInt32  charcode )
  {
    BDF_CMap          cmap      = (BDF_CMap)bdfcmap;
    BDF_encoding_el*  encodings = cmap->encodings;
    FT_ULong          min, max, mid; /* num_encodings */
    FT_UShort         result    = 0; /* encodings->glyph */


    min = 0;
    max = cmap->num_encodings;

    while ( min < max )
    {
      FT_ULong  code;


      mid  = ( min + max ) >> 1;
      code = (FT_ULong)encodings[mid].enc;

      if ( charcode == code )
      {
        /* increase glyph index by 1 --              */
        /* we reserve slot 0 for the undefined glyph */
        result = encodings[mid].glyph + 1;
        break;
      }

      if ( charcode < code )
        max = mid;
      else
        min = mid + 1;
    }

    return result;
  }